

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

int __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
::shutdown(dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>_>
           *this,int __fd,int __how)

{
  long lVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this->m_shutdown_started = true;
  for (p_Var3 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    lVar1 = *(long *)(p_Var3 + 2);
    LOCK();
    *(undefined4 *)(lVar1 + 8) = 0;
    UNLOCK();
    reuse::work_thread::demand_queue_details::
    queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
    ::stop_service((queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                    *)(lVar1 + 0x10));
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar2;
}

Assistant:

virtual void
		shutdown() override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				// Starting shutdown process.
				// New groups will not be created. But old groups remain.
				m_shutdown_started = true;

				std::for_each(
					m_groups.begin(),
					m_groups.end(),
					call_shutdown< typename active_group_map_t::value_type > );
			}